

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

Cba_Man_t * Cba_ManDeriveFromGia(Gia_Man_t *pGia,int fUseXor)

{
  Vec_Int_t *p;
  Gia_Obj_t *pGVar1;
  Abc_Nam_t *p_00;
  Vec_Ptr_t *pVVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  int x;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  Cba_Man_t *p_01;
  Cba_Ntk_t *pNtk;
  Vec_Int_t *vLit2Fon;
  int *__s;
  char *pcVar12;
  int *piVar13;
  Vec_Int_t *pVVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  int local_34;
  
  __s = (int *)0x0;
  p_01 = Cba_ManAlloc(pGia->pSpec,1,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,(Abc_Nam_t *)0x0,
                      (Hash_IntMan_t *)0x0);
  iVar6 = Abc_NamStrFindOrAdd(p_01->pStrs,pGia->pName,(int *)0x0);
  pNtk = Cba_NtkAlloc(p_01,iVar6,pGia->vCis->nSize,pGia->vCos->nSize,1000,2000,2000);
  iVar6 = pGia->nObjs;
  iVar11 = iVar6 * 2;
  vLit2Fon = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar11 - 1U) {
    iVar8 = iVar11;
  }
  vLit2Fon->nSize = 0;
  vLit2Fon->nCap = iVar8;
  if (iVar8 != 0) {
    __s = (int *)malloc((long)iVar8 << 2);
  }
  vLit2Fon->pArray = __s;
  vLit2Fon->nSize = iVar11;
  memset(__s,0xff,(long)iVar6 << 3);
  p_00 = p_01->pMods;
  pcVar12 = Abc_NamStr(pNtk->pDesign->pStrs,pNtk->NameId);
  iVar6 = Abc_NamStrFindOrAdd(p_00,pcVar12,&local_34);
  if (local_34 == 0) {
    if (iVar6 != pNtk->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                    ,0x264,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
    }
  }
  else {
    Abc_NamStr(pNtk->pDesign->pStrs,pNtk->NameId);
    printf("Network with name \"%s\" already exists.\n");
  }
  p = &pNtk->vObjName;
  uVar10 = (pNtk->vObjType).nCap;
  if ((pNtk->vObjName).nCap < (int)uVar10) {
    piVar13 = (pNtk->vObjName).pArray;
    if (piVar13 == (int *)0x0) {
      piVar13 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar13 = (int *)realloc(piVar13,(long)(int)uVar10 << 2);
    }
    (pNtk->vObjName).pArray = piVar13;
    if (piVar13 == (int *)0x0) goto LAB_00339bc4;
    p->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pNtk->vObjName).pArray,0,(ulong)uVar10 * 4);
  }
  (pNtk->vObjName).nSize = uVar10;
  pVVar14 = pGia->vCis;
  if (0 < pVVar14->nSize) {
    uVar16 = 0;
    do {
      uVar10 = pVVar14->pArray[uVar16];
      if (((int)uVar10 < 0) || (pGia->nObjs <= (int)uVar10)) goto LAB_00339a66;
      if ((ulong)uVar10 == 0) break;
      pVVar2 = pGia->vNamesIn;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        iVar6 = Cba_NtkNewStrId(pNtk,"i%d",uVar16 & 0xffffffff);
      }
      else {
        if ((long)pVVar2->nSize <= (long)uVar16) goto LAB_00339b67;
        iVar6 = Abc_NamStrFindOrAdd(p_01->pStrs,(char *)pVVar2->pArray[uVar16],(int *)0x0);
      }
      uVar7 = Cba_ObjAlloc(pNtk,CBA_OBJ_PI,0,1);
      Cba_ObjSetName(pNtk,uVar7,iVar6);
      if ((int)uVar7 < 1) goto LAB_00339a85;
      if ((pNtk->vObjFon0).nSize <= (int)uVar7) goto LAB_00339a47;
      if (iVar11 <= (int)(uVar10 * 2)) goto LAB_00339b48;
      __s[(ulong)uVar10 * 2] = (pNtk->vObjFon0).pArray[uVar7];
      uVar16 = uVar16 + 1;
      pVVar14 = pGia->vCis;
    } while ((long)uVar16 < (long)pVVar14->nSize);
  }
  if (0 < pGia->nObjs) {
    iVar6 = 0;
    lVar15 = 0;
    lVar17 = 0;
    do {
      pGVar3 = pGia->pObjs;
      uVar16 = *(ulong *)(&pGVar3->field_0x0 + lVar15);
      uVar10 = (uint)uVar16;
      if ((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) {
        if ((int)((int)lVar17 - (uVar10 & 0x1fffffff)) < 0) goto LAB_00339aa4;
        uVar7 = (uint)(uVar16 >> 0x20) & 0x1fffffff;
        if ((int)((int)lVar17 - uVar7) < 0) goto LAB_00339aa4;
        pGVar1 = (Gia_Obj_t *)(&pGVar3->field_0x0 + lVar15);
        x = Cba_NtkInsertGiaLit(pNtk,iVar6 + (uint)((uVar10 >> 0x1d & 1) != 0) +
                                     (uVar10 & 0x1fffffff) * -2,vLit2Fon,fUseXor);
        iVar8 = Cba_NtkInsertGiaLit(pNtk,iVar6 + (uint)((uVar16 >> 0x3d & 1) != 0) + uVar7 * -2,
                                    vLit2Fon,fUseXor);
        pGVar4 = pGia->pObjs;
        if ((pGVar1 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        puVar5 = pGia->pMuxes;
        if ((puVar5 == (uint *)0x0) ||
           (puVar5[(int)((ulong)((long)pGVar3 + (lVar15 - (long)pGVar4)) >> 2) * -0x55555555] == 0))
        {
          uVar10 = (uint)*(undefined8 *)pGVar1;
          if (((int)uVar10 < 0) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                          ,0x414,
                          "int Cba_NtkInsertGiaObj(Cba_Ntk_t *, Gia_Man_t *, int, Vec_Int_t *, int)"
                         );
          }
          uVar10 = Cba_ObjAlloc(pNtk,(uint)((uVar10 & 0x1fffffff) <
                                           ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) &
                                           0x1fffffff)) * 4 + CBA_BOX_AND,2,1);
          Cba_ObjSetFinFon(pNtk,uVar10,0,x);
          iVar9 = 1;
        }
        else {
          iVar9 = Cba_NtkInsertGiaLit(pNtk,-(uint)(puVar5[lVar17] == 0) | puVar5[lVar17],vLit2Fon,
                                      fUseXor);
          uVar10 = Cba_ObjAlloc(pNtk,CBA_BOX_MUX,3,1);
          Cba_ObjSetFinFon(pNtk,uVar10,0,iVar9);
          Cba_ObjSetFinFon(pNtk,uVar10,1,iVar8);
          iVar9 = 2;
          iVar8 = x;
        }
        Cba_ObjSetFinFon(pNtk,uVar10,iVar9,iVar8);
        if ((int)uVar10 < 1) goto LAB_00339a85;
        if ((pNtk->vObjFon0).nSize <= (int)uVar10) goto LAB_00339a47;
        if (iVar11 <= iVar6) {
LAB_00339b48:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar17 * 2] = (pNtk->vObjFon0).pArray[uVar10];
      }
      lVar17 = lVar17 + 1;
      lVar15 = lVar15 + 0xc;
      iVar6 = iVar6 + 2;
    } while (lVar17 < pGia->nObjs);
  }
  pVVar14 = pGia->vCos;
  if (0 < pVVar14->nSize) {
    lVar15 = 0;
    do {
      iVar6 = pVVar14->pArray[lVar15];
      if (((long)iVar6 < 0) || (pGia->nObjs <= iVar6)) goto LAB_00339a66;
      if (iVar6 == 0) break;
      iVar11 = iVar6 - (*(uint *)(pGia->pObjs + iVar6) & 0x1fffffff);
      if (iVar11 < 0) goto LAB_00339aa4;
      Cba_NtkInsertGiaLit(pNtk,(*(uint *)(pGia->pObjs + iVar6) >> 0x1d & 1) + iVar11 * 2,vLit2Fon,
                          fUseXor);
      lVar15 = lVar15 + 1;
      pVVar14 = pGia->vCos;
    } while (lVar15 < pVVar14->nSize);
  }
  pVVar14 = pGia->vCos;
  if (0 < pVVar14->nSize) {
    uVar16 = 0;
    do {
      iVar6 = pVVar14->pArray[uVar16];
      if (((long)iVar6 < 0) || (pGia->nObjs <= iVar6)) {
LAB_00339a66:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (iVar6 == 0) break;
      iVar11 = iVar6 - (*(uint *)(pGia->pObjs + iVar6) & 0x1fffffff);
      if (iVar11 < 0) {
LAB_00339aa4:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10b,"int Abc_Var2Lit(int, int)");
      }
      iVar6 = Cba_NtkInsertGiaLit(pNtk,(*(uint *)(pGia->pObjs + iVar6) >> 0x1d & 1) + iVar11 * 2,
                                  vLit2Fon,fUseXor);
      uVar10 = Cba_ObjAlloc(pNtk,CBA_BOX_BUF,1,1);
      Cba_ObjSetFinFon(pNtk,uVar10,0,iVar6);
      if ((int)uVar10 < 1) goto LAB_00339a85;
      if ((pNtk->vObjFon0).nSize <= (int)uVar10) goto LAB_00339a47;
      iVar6 = (pNtk->vObjFon0).pArray[uVar10];
      pVVar2 = pGia->vNamesOut;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        iVar11 = Cba_NtkNewStrId(pNtk,"o%d",uVar16 & 0xffffffff);
      }
      else {
        if ((long)pVVar2->nSize <= (long)uVar16) {
LAB_00339b67:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar11 = Abc_NamStrFindOrAdd(p_01->pStrs,(char *)pVVar2->pArray[uVar16],(int *)0x0);
      }
      iVar8 = Cba_ObjAlloc(pNtk,CBA_OBJ_PO,1,0);
      Cba_ObjSetName(pNtk,iVar8,iVar11);
      Cba_ObjSetFinFon(pNtk,iVar8,0,iVar6);
      uVar16 = uVar16 + 1;
      pVVar14 = pGia->vCos;
    } while ((long)uVar16 < (long)pVVar14->nSize);
  }
  pVVar14 = &pNtk->vFonName;
  uVar10 = (pNtk->vFonObj).nCap;
  if ((pNtk->vFonName).nCap < (int)uVar10) {
    piVar13 = (pNtk->vFonName).pArray;
    if (piVar13 == (int *)0x0) {
      piVar13 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar13 = (int *)realloc(piVar13,(long)(int)uVar10 << 2);
    }
    (pNtk->vFonName).pArray = piVar13;
    if (piVar13 == (int *)0x0) goto LAB_00339bc4;
    pVVar14->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pNtk->vFonName).pArray,0,(ulong)uVar10 * 4);
  }
  (pNtk->vFonName).nSize = uVar10;
  uVar10 = (pNtk->vFonObj).nCap;
  if ((pNtk->vFonName).nCap < (int)uVar10) {
    piVar13 = (pNtk->vFonName).pArray;
    if (piVar13 == (int *)0x0) {
      piVar13 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar13 = (int *)realloc(piVar13,(long)(int)uVar10 << 2);
    }
    (pNtk->vFonName).pArray = piVar13;
    if (piVar13 == (int *)0x0) {
LAB_00339bc4:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar14->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((pNtk->vFonName).pArray,0,(ulong)uVar10 * 4);
  }
  (pNtk->vFonName).nSize = uVar10;
  if (0 < (pNtk->vInputs).nSize) {
    lVar15 = 0;
    do {
      iVar6 = (pNtk->vInputs).pArray[lVar15];
      lVar17 = (long)iVar6;
      if (lVar17 < 1) {
LAB_00339a85:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((pNtk->vObjFon0).nSize <= iVar6) goto LAB_00339a47;
      if ((pNtk->vFonName).nSize < 1) goto LAB_00339ac3;
      uVar10 = (pNtk->vObjFon0).pArray[lVar17];
      if ((int)uVar10 < 1) {
        pcVar12 = "Cba_FonIsReal(f)";
        goto LAB_00339af2;
      }
      Vec_IntFillExtra(pVVar14,uVar10 + 1,0);
      if ((pNtk->vFonName).nSize <= (int)uVar10) goto LAB_00339a47;
      if ((pNtk->vFonName).pArray[uVar10] == 0) {
        if ((pNtk->vObjName).nSize < 1) goto LAB_00339b86;
        Vec_IntFillExtra(p,iVar6 + 1,0);
        if ((pNtk->vObjName).nSize <= iVar6) goto LAB_00339a47;
        Cba_FonSetName(pNtk,uVar10,(pNtk->vObjName).pArray[lVar17]);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (pNtk->vInputs).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar15 = 0;
    do {
      iVar6 = (pNtk->vOutputs).pArray[lVar15];
      lVar17 = (long)iVar6;
      if (lVar17 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x16b,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((pNtk->vObjFin0).nSize <= iVar6) {
LAB_00339a47:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar11 = (pNtk->vObjFin0).pArray[lVar17];
      if ((long)iVar11 < 1) {
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((pNtk->vFinFon).nSize <= iVar11) goto LAB_00339a47;
      iVar11 = (pNtk->vFinFon).pArray[iVar11];
      if (0 < (long)iVar11) {
        if ((pNtk->vFonName).nSize < 1) {
LAB_00339ac3:
          pcVar12 = "Cba_NtkHasFonNames(p)";
LAB_00339af2:
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                        ,0x18a,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(pVVar14,iVar11 + 1,0);
        if ((pNtk->vFonName).nSize <= iVar11) goto LAB_00339a47;
        if ((pNtk->vFonName).pArray[iVar11] == 0) {
          if ((pNtk->vObjName).nSize < 1) {
LAB_00339b86:
            __assert_fail("Cba_NtkHasObjNames(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                          ,0x15d,"int Cba_ObjName(Cba_Ntk_t *, int)");
          }
          Vec_IntFillExtra(p,iVar6 + 1,0);
          if ((pNtk->vObjName).nSize <= iVar6) goto LAB_00339a47;
          Cba_FonSetName(pNtk,iVar11,(pNtk->vObjName).pArray[lVar17]);
        }
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (pNtk->vOutputs).nSize);
  }
  Cba_NtkAddMissingFonNames(pNtk,"a");
  if (__s != (int *)0x0) {
    free(__s);
    vLit2Fon->pArray = (int *)0x0;
  }
  free(vLit2Fon);
  return p_01;
}

Assistant:

Cba_Man_t * Cba_ManDeriveFromGia( Gia_Man_t * pGia, int fUseXor )
{
    Cba_Man_t * p = Cba_ManAlloc( pGia->pSpec, 1, NULL, NULL, NULL, NULL );
    Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Abc_NamStrFindOrAdd(p->pStrs, pGia->pName, NULL), Gia_ManCiNum(pGia), Gia_ManCoNum(pGia), 1000, 2000, 2000 );
    Vec_Int_t * vLit2Fon = Vec_IntStartFull( 2*Gia_ManObjNum(pGia) );
    int i, iObj, iObjNew, NameId, iLit0, iFon0;
    Gia_Obj_t * pObj;
    //Cba_ManPrepareTypeNames( p );
    Cba_NtkAdd( p, pNtk );
    Cba_NtkCleanObjNames( pNtk );
    Gia_ManForEachCiId( pGia, iObj, i )
    {
        NameId = pGia->vNamesIn? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesIn, i), NULL) : Cba_NtkNewStrId(pNtk, "i%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Vec_IntWriteEntry( vLit2Fon, Abc_Var2Lit(iObj, 0), Cba_ObjFon0(pNtk, iObjNew) );
    }
    Gia_ManForEachAndId( pGia, iObj )
        Cba_NtkInsertGiaObj( pNtk, pGia, iObj, vLit2Fon, fUseXor );
    // create inverters if needed
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
    }
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
        iObjNew = Cba_ObjAlloc( pNtk, CBA_BOX_BUF, 1, 1 );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
        iFon0 = Cba_ObjFon0(pNtk, iObjNew); // non-const fon unique for this output
        NameId = pGia->vNamesOut? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesOut, i), NULL) : Cba_NtkNewStrId(pNtk, "o%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
    }
    Cba_NtkCleanFonNames( pNtk );
    Cba_NtkCreateFonNames( pNtk, "a" );
    Vec_IntFree( vLit2Fon );
    return p;
}